

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

QString * __thiscall
QTextHtmlExporter::findUrlForImage
          (QString *__return_storage_ptr__,QTextHtmlExporter *this,QTextDocument *doc,
          qint64 cacheKey,bool isPixmap)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QTextDocument *pQVar4;
  qint64 qVar5;
  QMetaType QVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  QImageData *pQVar9;
  _Rb_tree_node_base *p_Var10;
  QImage *image;
  _Base_ptr *pp_Var11;
  QPixmap *pixmap;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  QImage t;
  undefined1 local_58 [16];
  QImageData *local_48;
  QMetaType local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    pQVar4 = doc;
    if (pQVar4 == (QTextDocument *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_004c963e;
    }
    doc = (QTextDocument *)QMetaObject::cast((QObject *)&QTextDocument::staticMetaObject);
  } while (doc != (QTextDocument *)0x0);
  lVar1 = *(long *)&pQVar4->field_0x8;
  lVar8 = *(long *)(lVar1 + 0x188);
  if (lVar8 == 0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var7 = *(_Rb_tree_node_base **)(lVar8 + 0x20);
  }
  p_Var10 = (_Rb_tree_node_base *)(lVar8 + 0x10);
  if (lVar8 == 0) {
    p_Var10 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var7 != p_Var10) {
    do {
      pixmap = (QPixmap *)&p_Var7[1]._M_parent;
      iVar3 = ::QVariant::typeId((QVariant *)pixmap);
      if (iVar3 == 0x1006 && !isPixmap) {
        local_40.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QImage>::metaType;
        local_58._0_8_ = *(ulong *)(p_Var7 + 2) & 0xfffffffffffffffc;
        bVar2 = comparesEqual((QMetaType *)local_58,&local_40);
        if (bVar2) {
          image = (QImage *)pixmap;
          if ((p_Var7[2]._M_color & _S_black) != _S_red) {
            image = (QImage *)
                    ((long)&(*(_Base_ptr *)pixmap)->_M_color +
                    (long)*(int *)&(*(_Base_ptr *)pixmap)->field_0x4);
          }
          QImage::QImage((QImage *)local_58,image);
        }
        else {
          local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QImage::QImage((QImage *)local_58);
          QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
          pp_Var11 = (_Base_ptr *)pixmap;
          if ((p_Var7[2]._M_color & _S_black) != _S_red) {
            pp_Var11 = (_Base_ptr *)
                       ((long)&(*(_Base_ptr *)pixmap)->_M_color +
                       (long)*(int *)&(*(_Base_ptr *)pixmap)->field_0x4);
          }
          QMetaType::convert(QVar6,pp_Var11,local_40,(QImage *)local_58);
        }
        qVar5 = QImage::cacheKey((QImage *)local_58);
        QImage::~QImage((QImage *)local_58);
        if (qVar5 == cacheKey) break;
      }
      iVar3 = ::QVariant::typeId((QVariant *)pixmap);
      if (iVar3 == 0x1001 && isPixmap) {
        local_40.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QPixmap>::metaType;
        local_58._0_8_ = *(ulong *)(p_Var7 + 2) & 0xfffffffffffffffc;
        bVar2 = comparesEqual((QMetaType *)local_58,&local_40);
        if (bVar2) {
          if ((p_Var7[2]._M_color & _S_black) != _S_red) {
            pixmap = (QPixmap *)
                     ((long)&(*(_Base_ptr *)pixmap)->_M_color +
                     (long)*(int *)&(*(_Base_ptr *)pixmap)->field_0x4);
          }
          QPixmap::QPixmap((QPixmap *)local_58,pixmap);
        }
        else {
          local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QPixmap::QPixmap((QPixmap *)local_58);
          QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
          if ((p_Var7[2]._M_color & _S_black) != _S_red) {
            pixmap = (QPixmap *)
                     ((long)&(*(_Base_ptr *)pixmap)->_M_color +
                     (long)*(int *)&(*(_Base_ptr *)pixmap)->field_0x4);
          }
          QMetaType::convert(QVar6,pixmap,local_40,(QImage *)local_58);
        }
        qVar5 = QPixmap::cacheKey((QPixmap *)local_58);
        QPixmap::~QPixmap((QPixmap *)local_58);
        if (qVar5 == cacheKey) break;
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      p_Var10 = (_Rb_tree_node_base *)(*(long *)(lVar1 + 0x188) + 0x10);
      if (*(long *)(lVar1 + 0x188) == 0) {
        p_Var10 = (_Rb_tree_node_base *)0x0;
      }
    } while (p_Var7 != p_Var10);
    lVar8 = *(long *)(lVar1 + 0x188);
  }
  p_Var10 = (_Rb_tree_node_base *)(lVar8 + 0x10);
  if (lVar8 == 0) {
    p_Var10 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var7 == p_Var10) {
    uVar12 = 0;
    uVar13 = 0;
    uVar14._0_2_ = 0;
    uVar14._2_2_ = 0;
    uVar15 = 0;
    pQVar9 = (QImageData *)0x0;
  }
  else {
    QUrl::toString(local_58,p_Var7 + 1,0);
    pQVar9 = local_48;
    uVar12 = local_58._0_4_;
    uVar13 = local_58._4_4_;
    uVar14 = local_58._8_4_;
    uVar15 = local_58._12_4_;
  }
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar12;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar13;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar14;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar15;
  (__return_storage_ptr__->d).size = (qsizetype)pQVar9;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004c963e:
  __stack_chk_fail();
}

Assistant:

QString QTextHtmlExporter::findUrlForImage(const QTextDocument *doc, qint64 cacheKey, bool isPixmap)
{
    QString url;
    if (!doc)
        return url;

    if (QTextDocument *parent = qobject_cast<QTextDocument *>(doc->parent()))
        return findUrlForImage(parent, cacheKey, isPixmap);

    const QTextDocumentPrivate *priv = QTextDocumentPrivate::get(doc);
    Q_ASSERT(priv != nullptr);

    QMap<QUrl, QVariant>::const_iterator it = priv->cachedResources.constBegin();
    for (; it != priv->cachedResources.constEnd(); ++it) {

        const QVariant &v = it.value();
        if (v.userType() == QMetaType::QImage && !isPixmap) {
            if (qvariant_cast<QImage>(v).cacheKey() == cacheKey)
                break;
        }

        if (v.userType() == QMetaType::QPixmap && isPixmap) {
            if (qvariant_cast<QPixmap>(v).cacheKey() == cacheKey)
                break;
        }
    }

    if (it != priv->cachedResources.constEnd())
        url = it.key().toString();

    return url;
}